

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,string *value)

{
  bool bVar1;
  undefined1 local_50 [8];
  StringData sdata;
  string *value_local;
  AsciiParser *this_local;
  
  if (value == (string *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    sdata._40_8_ = value;
    tinyusdz::value::StringData::StringData((StringData *)local_50);
    bVar1 = MaybeTripleQuotedString(this,(StringData *)local_50);
    if (bVar1) {
      ::std::__cxx11::string::operator=((string *)sdata._40_8_,(string *)local_50);
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      bVar1 = MaybeString(this,(StringData *)local_50);
      if (bVar1) {
        ::std::__cxx11::string::operator=((string *)sdata._40_8_,(string *)local_50);
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    tinyusdz::value::StringData::~StringData((StringData *)local_50);
    if (!bVar1) {
      this_local._7_1_ = ReadStringLiteral(this,(string *)sdata._40_8_);
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ReadBasicType(std::string *value) {
  if (!value) {
    return false;
  }

  // May be triple-quoted string
  {
    value::StringData sdata;
    if (MaybeTripleQuotedString(&sdata)) {
      (*value) = sdata.value;
      return true;

    } else if (MaybeString(&sdata)) {
      (*value) = sdata.value;
      return true;
    }
  }

  // Just in case
  return ReadStringLiteral(value);
}